

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateRetransmits(Session *this,SEQNUM beginSeqNo,SEQNUM endSeqNo)

{
  bool bVar1;
  DataDictionary *dataDictionary;
  DataDictionary *applicationDataDictionary;
  message_order *pmVar2;
  message_order *pmVar3;
  message_order *pmVar4;
  Message *this_00;
  uint64_t uVar5;
  uint64_t uVar6;
  string *psVar7;
  IntTConvertor<unsigned_long> *this_01;
  uint64_t uVar8;
  SEQNUM value;
  pointer string;
  size_t __n;
  void *__buf;
  unsigned_long value_00;
  SessionState *this_02;
  int __flags;
  uint64_t local_388;
  string strMsgType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  MsgSeqNum msgSeqNum;
  string messageString;
  ApplVerID applVerID;
  MsgType msgType;
  Message msg;
  FieldBase local_88;
  
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_02 = &this->m_state;
  SessionState::get(this_02,beginSeqNo,endSeqNo,&messages);
  MsgSeqNum::MsgSeqNum(&msgSeqNum,0);
  MsgType::MsgType(&msgType);
  messageString._M_dataplus._M_p = (pointer)&messageString.field_2;
  messageString._M_string_length = 0;
  messageString.field_2._M_local_buf[0] = '\0';
  bVar1 = false;
  uVar8 = 0;
  string = messages.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_388 = beginSeqNo;
  do {
    if (string == messages.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (uVar8 != 0) {
        uVar6 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
        generateSequenceReset(this,uVar8,uVar6 + 1);
      }
      uVar8 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      if (uVar8 < endSeqNo) {
        EndSeqNo::EndSeqNo((EndSeqNo *)&msg,endSeqNo + 1);
        uVar8 = UInt64Field::getValue((UInt64Field *)&msg);
        FieldBase::~FieldBase((FieldBase *)&msg);
        value = SessionState::getNextSenderMsgSeqNum(this_02);
        if (value < uVar8) {
          EndSeqNo::EndSeqNo((EndSeqNo *)&msg,value);
          uVar8 = UInt64Field::getValue((UInt64Field *)&msg);
          FieldBase::~FieldBase((FieldBase *)&msg);
        }
        if (bVar1) {
          uVar6 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
          beginSeqNo = uVar6 + 1;
        }
        generateSequenceReset(this,beginSeqNo,uVar8);
      }
      std::__cxx11::string::~string((string *)&messageString);
      FieldBase::~FieldBase((FieldBase *)&msgType);
      FieldBase::~FieldBase((FieldBase *)&msgSeqNum);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&messages);
      return;
    }
    strMsgType._M_dataplus._M_p = (pointer)&strMsgType.field_2;
    strMsgType._M_string_length = 0;
    strMsgType.field_2._M_local_buf[0] = '\0';
    dataDictionary =
         DataDictionaryProvider::getSessionDataDictionary
                   (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
    if (dataDictionary->m_storeMsgFieldsOrder == true) {
      std::__cxx11::string::find((char *)string,0x1cf124);
      std::__cxx11::string::find((char)string,1);
      std::__cxx11::string::substr((ulong)&msg,(ulong)string);
      std::__cxx11::string::operator=((string *)&strMsgType,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((this->m_sessionID).m_isFIXT == true) {
      Message::Message(&msg);
      Message::setStringHeader(&msg,string);
      ApplVerID::ApplVerID(&applVerID);
      bVar1 = FieldMap::getFieldIfSet(&msg.m_header.super_FieldMap,(FieldBase *)&applVerID);
      if (!bVar1) {
        ApplVerID::ApplVerID((ApplVerID *)&local_88,&this->m_senderDefaultApplVerID);
        FieldBase::operator=((FieldBase *)&applVerID,&local_88);
        FieldBase::~FieldBase(&local_88);
      }
      applicationDataDictionary =
           DataDictionaryProvider::getApplicationDataDictionary
                     (&this->m_dataDictionaryProvider,&applVerID);
      if (strMsgType._M_string_length == 0) {
        this_00 = (Message *)operator_new(0x158);
        Message::Message(this_00,string,dataDictionary,applicationDataDictionary,
                         this->m_validateLengthAndChecksum);
      }
      else {
        pmVar2 = DataDictionary::getHeaderOrderedFields(dataDictionary);
        pmVar3 = DataDictionary::getTrailerOrderedFields(dataDictionary);
        pmVar4 = DataDictionary::getMessageOrderedFields(applicationDataDictionary,&strMsgType);
        this_00 = (Message *)operator_new(0x158);
        Message::Message(this_00,pmVar2,pmVar3,pmVar4,string,dataDictionary,
                         applicationDataDictionary,this->m_validateLengthAndChecksum);
      }
      FieldBase::~FieldBase((FieldBase *)&applVerID);
      Message::~Message(&msg);
    }
    else if (strMsgType._M_string_length == 0) {
      this_00 = (Message *)operator_new(0x158);
      Message::Message(this_00,string,dataDictionary,this->m_validateLengthAndChecksum);
    }
    else {
      pmVar2 = DataDictionary::getHeaderOrderedFields(dataDictionary);
      pmVar3 = DataDictionary::getTrailerOrderedFields(dataDictionary);
      pmVar4 = DataDictionary::getMessageOrderedFields(dataDictionary,&strMsgType);
      this_00 = (Message *)operator_new(0x158);
      Message::Message(this_00,pmVar2,pmVar3,pmVar4,string,dataDictionary,
                       this->m_validateLengthAndChecksum);
    }
    FieldMap::getField(&(this_00->m_header).super_FieldMap,(FieldBase *)&msgSeqNum);
    FieldMap::getField(&(this_00->m_header).super_FieldMap,(FieldBase *)&msgType);
    uVar5 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
    uVar6 = local_388;
    if (uVar8 != 0) {
      uVar6 = uVar8;
    }
    if (local_388 == uVar5) {
      uVar6 = uVar8;
    }
    uVar8 = uVar6;
    bVar1 = Message::isAdminMsgType(&msgType);
    if (bVar1) {
LAB_001af3b8:
      if (uVar8 == 0) {
        uVar8 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      }
      bVar1 = false;
    }
    else {
      bVar1 = resend(this,this_00);
      if (!bVar1) goto LAB_001af3b8;
      if (uVar8 != 0) {
        uVar6 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
        generateSequenceReset(this,uVar8,uVar6);
      }
      __n = 9;
      __flags = 10;
      psVar7 = Message::toString(this_00,&messageString,8,9,10);
      send(this,(int)psVar7,__buf,__n,__flags);
      this_01 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_((string *)&applVerID,this_01,value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     "Resending Message: ",(string *)&applVerID);
      SessionState::onEvent(this_02,(string *)&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::~string((string *)&applVerID);
      bVar1 = true;
      uVar8 = 0;
    }
    local_388 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
    local_388 = local_388 + 1;
    std::__cxx11::string::~string((string *)&strMsgType);
    (*(this_00->super_FieldMap)._vptr_FieldMap[1])(this_00);
    string = string + 1;
  } while( true );
}

Assistant:

void Session::generateRetransmits(SEQNUM beginSeqNo, SEQNUM endSeqNo) {
  std::vector<std::string> messages;
  m_state.get(beginSeqNo, endSeqNo, messages);

  std::vector<std::string>::iterator i;
  MsgSeqNum msgSeqNum(0);
  MsgType msgType;
  SEQNUM begin = 0;
  SEQNUM current = beginSeqNo;
  bool appMessageJustSent = false;
  std::string messageString;

  for (i = messages.begin(); i != messages.end(); ++i) {
    appMessageJustSent = false;
    std::unique_ptr<FIX::Message> pMsg;
    std::string strMsgType;
    const DataDictionary &sessionDD = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if (sessionDD.isMessageFieldsOrderPreserved()) {
      std::string::size_type equalSign = (*i).find("\00135=");
      equalSign += 4;
      std::string::size_type soh = (*i).find_first_of('\001', equalSign);
      strMsgType = (*i).substr(equalSign, soh - equalSign);
    }

    if (m_sessionID.isFIXT()) {
      Message msg;
      msg.setStringHeader(*i);
      ApplVerID applVerID;
      if (!msg.getHeader().getFieldIfSet(applVerID)) {
        applVerID = m_senderDefaultApplVerID;
      }

      const DataDictionary &applicationDD = m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      if (strMsgType.empty()) {
        pMsg.reset(new Message(*i, sessionDD, applicationDD, m_validateLengthAndChecksum));
      } else {
        const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order &messageOrder = applicationDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(
            headerOrder,
            trailerOrder,
            messageOrder,
            *i,
            sessionDD,
            applicationDD,
            m_validateLengthAndChecksum));
      }
    } else {
      if (strMsgType.empty()) {
        pMsg.reset(new Message(*i, sessionDD, m_validateLengthAndChecksum));
      } else {
        const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order &messageOrder = sessionDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(headerOrder, trailerOrder, messageOrder, *i, sessionDD, m_validateLengthAndChecksum));
      }
    }

    Message &msg = *pMsg;

    msg.getHeader().getField(msgSeqNum);
    msg.getHeader().getField(msgType);

    if ((current != msgSeqNum) && !begin) {
      begin = current;
    }

    if (Message::isAdminMsgType(msgType)) {
      if (!begin) {
        begin = msgSeqNum;
      }
    } else {
      if (resend(msg)) {
        if (begin) {
          generateSequenceReset(begin, msgSeqNum);
        }
        send(msg.toString(messageString));
        m_state.onEvent("Resending Message: " + SEQNUM_CONVERTOR::convert(msgSeqNum));
        begin = 0;
        appMessageJustSent = true;
      } else {
        if (!begin) {
          begin = msgSeqNum;
        }
      }
    }
    current = msgSeqNum + 1;
  }
  if (begin) {
    generateSequenceReset(begin, msgSeqNum + 1);
  }

  if (endSeqNo > msgSeqNum) {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    auto next = m_state.getNextSenderMsgSeqNum();
    if (endSeqNo > next) {
      endSeqNo = EndSeqNo(next);
    }
    if (appMessageJustSent) {
      beginSeqNo = msgSeqNum + 1;
    }
    generateSequenceReset(beginSeqNo, endSeqNo);
  }
}